

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall
CConnman::AddWhitelistPermissionFlags
          (CConnman *this,NetPermissionFlags *flags,CNetAddr *addr,
          vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *ranges)

{
  long lVar1;
  pointer pNVar2;
  bool bVar3;
  NetPermissionFlags NVar4;
  NetWhitelistPermissions *subnet;
  pointer pNVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar2 = (ranges->
           super__Vector_base<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pNVar5 = (ranges->
                super__Vector_base<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>
                )._M_impl.super__Vector_impl_data._M_start; pNVar5 != pNVar2; pNVar5 = pNVar5 + 1) {
    bVar3 = CSubNet::Match(&pNVar5->m_subnet,addr);
    if (bVar3) {
      *flags = *flags | (pNVar5->super_NetPermissions).m_flags;
    }
  }
  if ((int)*flags < 0) {
    NVar4 = *flags & ~Implicit;
    *flags = NVar4;
    if (this->whitelist_forcerelay == true) {
      *flags = NVar4 | ForceRelay;
    }
    if (this->whitelist_relay == true) {
      *(undefined1 *)flags = (char)*flags | Relay;
    }
    *(undefined1 *)flags = (char)*flags | 0x70;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::AddWhitelistPermissionFlags(NetPermissionFlags& flags, const CNetAddr &addr, const std::vector<NetWhitelistPermissions>& ranges) const {
    for (const auto& subnet : ranges) {
        if (subnet.m_subnet.Match(addr)) {
            NetPermissions::AddFlag(flags, subnet.m_flags);
        }
    }
    if (NetPermissions::HasFlag(flags, NetPermissionFlags::Implicit)) {
        NetPermissions::ClearFlag(flags, NetPermissionFlags::Implicit);
        if (whitelist_forcerelay) NetPermissions::AddFlag(flags, NetPermissionFlags::ForceRelay);
        if (whitelist_relay) NetPermissions::AddFlag(flags, NetPermissionFlags::Relay);
        NetPermissions::AddFlag(flags, NetPermissionFlags::Mempool);
        NetPermissions::AddFlag(flags, NetPermissionFlags::NoBan);
    }
}